

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResumeThrow
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,Name tag,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  bool bVar1;
  Tag *pTVar2;
  size_t size;
  ResumeThrow *expr;
  char *pcVar3;
  _Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *handlerBlocks;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes;
  Signature SVar4;
  Name name;
  Name tag_00;
  optional<wasm::HeapType> ct_00;
  ResumeThrow local_1c0;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  undefined1 local_d8 [8];
  Result<wasm::ResumeTable> resumetable;
  undefined1 local_98 [8];
  Result<wasm::ResumeTable> _val;
  ChildPopper local_58 [4];
  _Storage<wasm::HeapType,_true> local_38;
  HeapType ct_local;
  
  pcVar3 = tag.super_IString.str._M_str;
  local_38 = (_Storage<wasm::HeapType,_true>)ct.id;
  if ((long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
    super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
    super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
    super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
    super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
    super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = tag.super_IString.str._M_len
    ;
    bVar1 = HeapType::isContinuation(&local_38._M_value);
    if (bVar1) {
      local_1c0.handlerTags.allocator = &this->wasm->allocator;
      local_1c0.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression._id =
           ResumeThrowId;
      local_1c0.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression.type.id = 0;
      local_1c0.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      local_1c0.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
           = 0;
      local_1c0.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements = 0;
      local_1c0.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      local_1c0.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      usedElements = 0;
      local_1c0.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements = 0;
      local_1c0.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      local_1c0.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      local_1c0.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      local_1c0.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
      allocatedElements = 0;
      local_1c0.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data =
           (Type *)0x0;
      local_1c0.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements =
           0;
      local_1c0.tag.super_IString.str._M_len =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      name.super_IString.str._M_str = pcVar3;
      name.super_IString.str._M_len =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      local_1c0.tag.super_IString.str._M_str = pcVar3;
      local_1c0.handlerBlocks.allocator = local_1c0.handlerTags.allocator;
      local_1c0.operands.allocator = local_1c0.handlerTags.allocator;
      local_1c0.sentTypes.allocator = local_1c0.handlerTags.allocator;
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = pcVar3;
      pTVar2 = Module::getTag(this->wasm,name);
      SVar4 = HeapType::getSignature(&pTVar2->type);
      local_d8 = (undefined1  [8])SVar4.params.id;
      size = wasm::Type::size((Type *)local_d8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                (&local_1c0.operands.
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,size);
      local_118._8_8_ = 0;
      local_100 = std::
                  _Function_handler<wasm::Result<wasm::Name>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2465:5)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<wasm::Result<wasm::Name>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2465:5)>
                  ::_M_manager;
      local_f8._8_8_ = 0;
      local_e0 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2466:5)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2466:5)>
                 ::_M_manager;
      local_118._M_unused._M_object = this;
      local_f8._M_unused._M_object = this;
      makeResumeTable((Result<wasm::ResumeTable> *)local_d8,labels,
                      (function<wasm::Result<wasm::Name>_(unsigned_int)> *)&local_118,
                      (function<wasm::Result<wasm::Type>_(unsigned_int)> *)&local_f8);
      std::_Function_base::~_Function_base((_Function_base *)&local_f8);
      std::_Function_base::~_Function_base((_Function_base *)&local_118);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_98,
                      (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_d8);
      if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
          super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[0x28] == '\x01') {
        std::__cxx11::string::string((string *)local_58,(string *)local_98);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)local_38;
        local_58[0].builder = this;
        ChildPopper::visitResumeThrow((Result<wasm::Ok> *)local_98,local_58,&local_1c0,ct_00);
        if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
            super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[0x18] == '\x01') {
          std::__cxx11::string::string((string *)local_58,(string *)local_98);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
          anon_unknown_283::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_98,local_38._M_value.id,local_1c0.cont);
          if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
              _M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
            handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)0x0;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_d8;
            }
            sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x18;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x10);
            }
            tag_00.super_IString.str._M_str =
                 (char *)resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                         super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
            tag_00.super_IString.str._M_len =
                 _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                 super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
            expr = Builder::makeResumeThrow
                             (&this->builder,tag_00,tags,
                              (vector<wasm::Name,_std::allocator<wasm::Name>_> *)handlerBlocks,
                              sentTypes,&local_1c0.operands,local_1c0.cont);
            push(this,(Expression *)expr);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
            goto LAB_00ce2940;
          }
          std::__cxx11::string::string((string *)local_58,(string *)local_98);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
        }
        std::__cxx11::string::~string((string *)local_58);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
      }
LAB_00ce2940:
      std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_d8);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"expected continuation type",(allocator<char> *)local_d8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_1c0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"the sizes of tags and labels must be equal",
               (allocator<char> *)local_d8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_1c0);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResumeThrow(HeapType ct,
                           Name tag,
                           const std::vector<Name>& tags,
                           const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  ResumeThrow curr(wasm.allocator);
  curr.tag = tag;
  curr.operands.resize(wasm.getTag(tag)->params().size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResumeThrow(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResumeThrow(tag,
                               tags,
                               resumetable->targets,
                               resumetable->sentTypes,
                               std::move(curr.operands),
                               curr.cont));
  return Ok{};
}